

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

Vec_Str_t *
Glucose_GenerateCubes
          (bmcg_sat_solver **pSat,Vec_Int_t *vCiSatVars,Vec_Int_t *vVar2Index,int CubeLimit)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t __size;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  Vec_Int_t *p;
  int *piVar10;
  size_t sVar11;
  Vec_Str_t *p_00;
  ulong uVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  int iVar17;
  char **local_80;
  
  uVar2 = vCiSatVars->nSize;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pcVar9 = (char *)malloc(1000);
  pVVar8->pArray = pcVar9;
  p = (Vec_Int_t *)malloc(0x10);
  uVar7 = uVar2;
  if (uVar2 - 1 < 0xf) {
    uVar7 = 0x10;
  }
  p->nSize = 0;
  p->nCap = uVar7;
  if (uVar7 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar7 << 2);
  }
  sVar11 = (size_t)(int)uVar2;
  p->pArray = piVar10;
  iVar17 = uVar2 + 4;
  p_00 = (Vec_Str_t *)malloc(0x10);
  if (uVar2 + 3 < 0xf) {
    iVar17 = 0x10;
  }
  p_00->nCap = iVar17;
  if (iVar17 == 0) {
    p_00->pArray = (char *)0x0;
    uVar12 = (ulong)uVar2;
    if (0 < (int)uVar2) {
LAB_005c1d77:
      pcVar9 = (char *)malloc(uVar12);
      goto LAB_005c1d7c;
    }
    p_00->nSize = uVar2;
  }
  else {
    pcVar9 = (char *)malloc((long)iVar17);
    p_00->pArray = pcVar9;
    if (iVar17 < (int)uVar2) {
      uVar12 = sVar11;
      if (pcVar9 == (char *)0x0) goto LAB_005c1d77;
      pcVar9 = (char *)realloc(pcVar9,sVar11);
LAB_005c1d7c:
      p_00->pArray = pcVar9;
      p_00->nCap = uVar2;
    }
    p_00->nSize = uVar2;
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        p_00->pArray[uVar12] = '-';
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
      bVar5 = true;
      goto LAB_005c1db7;
    }
  }
  bVar5 = false;
LAB_005c1db7:
  local_80 = &p_00->pArray;
  iVar17 = 0;
  Vec_StrPrintF(p_00," 1\n");
  if (-1 < CubeLimit) {
    sVar15 = 1;
    if (1 < (long)sVar11) {
      sVar15 = sVar11;
    }
    while (iVar6 = glucose_solver_solve((SimpSolver *)pSat[1],(int *)0x0,0), iVar6 == 1) {
      p->nSize = 0;
      if (vCiSatVars->nSize < 1) {
        iVar6 = 0;
      }
      else {
        lVar16 = 0;
        do {
          iVar6 = vCiSatVars->pArray[lVar16];
          if ((long)iVar6 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p,(uint)(*(char *)(*(long *)((long)pSat[1] + 0x58) + (long)iVar6) != '\0') +
                        iVar6 * 2);
          lVar16 = lVar16 + 1;
        } while (lVar16 < vCiSatVars->nSize);
        iVar6 = p->nSize;
      }
      piVar10 = p->pArray;
      uVar7 = bmcg_sat_solver_minimize_assumptions(*pSat,piVar10,iVar6,0);
      if (iVar6 < (int)uVar7) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      p->nSize = uVar7;
      if (0 < (int)uVar7) {
        uVar12 = 0;
        do {
          if (piVar10[uVar12] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          piVar10[uVar12] = piVar10[uVar12] ^ 1;
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      if (p_00->nCap < (int)uVar2) {
        if (*local_80 == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar11);
        }
        else {
          pcVar9 = (char *)realloc(*local_80,sVar11);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = uVar2;
      }
      p_00->nSize = uVar2;
      if (bVar5) {
        sVar13 = 0;
        do {
          (*local_80)[sVar13] = '-';
          sVar13 = sVar13 + 1;
        } while (sVar15 != sVar13);
      }
      if ((int)uVar7 < 1) {
        iVar6 = 0;
      }
      else {
        uVar12 = 0;
        iVar6 = 0;
        do {
          uVar3 = piVar10[uVar12];
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (vVar2Index->nSize <= (int)(uVar3 >> 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar4 = vVar2Index->pArray[uVar3 >> 1];
          if ((ulong)uVar4 != 0xffffffff) {
            piVar10[iVar6] = uVar3;
            if (((int)uVar4 < 0) || ((int)uVar2 <= (int)uVar4)) {
              __assert_fail("Index >= 0 && Index < nSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                            ,0x316,
                            "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                           );
            }
            if (piVar10[uVar12] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            iVar6 = iVar6 + 1;
            (*local_80)[uVar4] = (byte)piVar10[uVar12] & 1 | 0x30;
          }
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      pcVar9 = *local_80;
      sVar13 = strlen(pcVar9);
      if (0 < (int)(uint)sVar13) {
        uVar12 = 0;
        do {
          cVar1 = pcVar9[uVar12];
          uVar7 = pVVar8->nSize;
          if (uVar7 == pVVar8->nCap) {
            if ((int)uVar7 < 0x10) {
              if (pVVar8->pArray == (char *)0x0) {
                pcVar14 = (char *)malloc(0x10);
              }
              else {
                pcVar14 = (char *)realloc(pVVar8->pArray,0x10);
              }
              pVVar8->pArray = pcVar14;
              pVVar8->nCap = 0x10;
            }
            else {
              __size = (ulong)uVar7 * 2;
              if (pVVar8->pArray == (char *)0x0) {
                pcVar14 = (char *)malloc(__size);
              }
              else {
                pcVar14 = (char *)realloc(pVVar8->pArray,__size);
              }
              pVVar8->pArray = pcVar14;
              pVVar8->nCap = (int)__size;
            }
          }
          else {
            pcVar14 = pVVar8->pArray;
          }
          pVVar8->nSize = uVar7 + 1;
          pcVar14[(int)uVar7] = cVar1;
          uVar12 = uVar12 + 1;
        } while (((uint)sVar13 & 0x7fffffff) != uVar12);
      }
      iVar6 = glucose_solver_addclause((SimpSolver *)pSat[1],piVar10,iVar6);
      if ((iVar6 == 0) || (iVar17 = iVar17 + 1, CubeLimit <= iVar17 && CubeLimit != 0))
      goto LAB_005c20b9;
    }
    if (iVar6 != -1) {
      __assert_fail("status == GLUCOSE_SAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x2fb,
                    "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
LAB_005c20b9:
    piVar10 = p->pArray;
  }
  if (piVar10 != (int *)0x0) {
    free(piVar10);
  }
  free(p);
  if (*local_80 != (char *)0x0) {
    free(*local_80);
  }
  free(p_00);
  uVar2 = pVVar8->nSize;
  if (uVar2 == pVVar8->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar8->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
      }
      pVVar8->pArray = pcVar9;
      pVVar8->nCap = 0x10;
    }
    else {
      sVar11 = (ulong)uVar2 * 2;
      if (pVVar8->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar11);
      }
      else {
        pcVar9 = (char *)realloc(pVVar8->pArray,sVar11);
      }
      pVVar8->pArray = pcVar9;
      pVVar8->nCap = (int)sVar11;
    }
  }
  else {
    pcVar9 = pVVar8->pArray;
  }
  pVVar8->nSize = uVar2 + 1;
  pcVar9[(int)uVar2] = '\0';
  return pVVar8;
}

Assistant:

Vec_Str_t * Glucose_GenerateCubes( bmcg_sat_solver * pSat[2], Vec_Int_t * vCiSatVars, Vec_Int_t * vVar2Index, int CubeLimit )
{
    int fCreatePrime = 1;
    int nCubes, nSupp = Vec_IntSize(vCiSatVars);
    Vec_Str_t * vSop  = Vec_StrAlloc( 1000 );
    Vec_Int_t * vLits = Vec_IntAlloc( nSupp );
    Vec_Str_t * vCube = Vec_StrAlloc( nSupp + 4 );
    Vec_StrFill( vCube, nSupp, '-' );
    Vec_StrPrintF( vCube, " 1\n\0" );
    for ( nCubes = 0; !CubeLimit || nCubes < CubeLimit; nCubes++ )
    {
        int * pFinal, nFinal, iVar, i, k = 0;
        // generate onset minterm
        int status = bmcg_sat_solver_solve( pSat[1], NULL, 0 );
        if ( status == GLUCOSE_UNSAT )
            break;
        assert( status == GLUCOSE_SAT );
        Vec_IntClear( vLits );
        Vec_IntForEachEntry( vCiSatVars, iVar, i )
            Vec_IntPush( vLits, Abc_Var2Lit(iVar, !bmcg_sat_solver_read_cex_varvalue(pSat[1], iVar)) );
        // expand against offset
        if ( fCreatePrime )
        {
            nFinal = bmcg_sat_solver_minimize_assumptions( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
            Vec_IntShrink( vLits, nFinal );
            pFinal = Vec_IntArray( vLits );
            for ( i = 0; i < nFinal; i++ )
                pFinal[i] = Abc_LitNot(pFinal[i]);
        }
        else
        {
            status = bmcg_sat_solver_solve( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits) );
            assert( status == GLUCOSE_UNSAT );
            nFinal = bmcg_sat_solver_final( pSat[0], &pFinal );
        }
        // print cube
        Vec_StrFill( vCube, nSupp, '-' );
        for ( i = 0; i < nFinal; i++ )
        {
            int Index = Vec_IntEntry(vVar2Index, Abc_Lit2Var(pFinal[i]));
            if ( Index == -1 )
                continue;
            pFinal[k++] = pFinal[i];
            assert( Index >= 0 && Index < nSupp );
            Vec_StrWriteEntry( vCube, Index, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
        }
        nFinal = k;
        Vec_StrAppend( vSop, Vec_StrArray(vCube) );
        //printf( "%s\n", Vec_StrArray(vCube) );
        // add blocking clause
        if ( !bmcg_sat_solver_addclause( pSat[1], pFinal, nFinal ) )
            break;
    }
    Vec_IntFree( vLits );
    Vec_StrFree( vCube );
    Vec_StrPush( vSop, '\0' );
    return vSop;
}